

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb2Flow.c
# Opt level: O3

Vec_Ptr_t * Llb_ManComputeCuts(Aig_Man_t *p,int Num,int fVerbose,int fVeryVerbose)

{
  ulong uVar1;
  Vec_Ptr_t *vUpper;
  int iVar2;
  int iVar3;
  Vec_Ptr_t *vResult;
  void **__ptr;
  Vec_Ptr_t *pVVar4;
  Vec_Ptr_t *vLower;
  long lVar5;
  long lVar6;
  uint uVar7;
  ulong uVar8;
  int iVar9;
  uint uVar10;
  uint uVar11;
  timespec ts;
  long local_80;
  long local_78;
  ulong local_70;
  long local_68;
  ulong local_50;
  timespec local_40;
  
  iVar3 = p->nObjs[6];
  iVar9 = p->nObjs[5];
  iVar2 = clock_gettime(3,&local_40);
  if (iVar2 < 0) {
    local_80 = 1;
  }
  else {
    lVar6 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_40.tv_nsec),8);
    local_80 = ((lVar6 >> 7) - (lVar6 >> 0x3f)) + local_40.tv_sec * -1000000;
  }
  vResult = (Vec_Ptr_t *)malloc(0x10);
  vResult->nCap = 100;
  __ptr = (void **)malloc(800);
  vResult->pArray = __ptr;
  pVVar4 = Llb_ManComputeCutLo(p);
  *__ptr = pVVar4;
  pVVar4 = Llb_ManComputeCutLi(p);
  vResult->nSize = 2;
  __ptr[1] = pVVar4;
  local_70 = 2;
  local_50 = 100;
  local_78 = 0;
  local_68 = 0;
  do {
    uVar8 = 1;
    lVar6 = 0x100000000;
    pVVar4 = (Vec_Ptr_t *)*__ptr;
LAB_007dc06e:
    vUpper = (Vec_Ptr_t *)__ptr[uVar8];
    iVar2 = Llb_ManCutVolume(p,pVVar4,vUpper);
    uVar11 = (uint)local_70;
    if (iVar2 <= (iVar3 + iVar9) / Num) {
LAB_007dc0ed:
      lVar6 = lVar6 + 0x100000000;
      lVar5 = local_68 + uVar8;
      uVar8 = uVar8 + 1;
      pVVar4 = vUpper;
      if (lVar5 == 1) goto LAB_007dc229;
      goto LAB_007dc06e;
    }
    if (fVeryVerbose == 0) {
      vLower = Llb_ManFlowFindBestCut(p,pVVar4,vUpper,Num);
      if (vLower != (Vec_Ptr_t *)0x0) goto LAB_007dc145;
      goto LAB_007dc0ed;
    }
    Llb_ManCutPrint(p,pVVar4,vUpper);
    vLower = Llb_ManFlowFindBestCut(p,pVVar4,vUpper,Num);
    if (vLower == (Vec_Ptr_t *)0x0) {
      puts("Could not break the cut.");
      putchar(10);
      goto LAB_007dc0ed;
    }
    Llb_ManCutPrint(p,vLower,vUpper);
    Llb_ManCutPrint(p,pVVar4,vLower);
    putchar(10);
LAB_007dc145:
    uVar7 = (uint)uVar8;
    if ((int)local_68 + uVar7 == 2) {
LAB_007dc229:
      vResult->pArray = __ptr;
      if (fVerbose != 0) {
        printf("Finished computing %d partitions.  ",(ulong)(uVar11 - 1));
        iVar9 = 3;
        iVar3 = clock_gettime(3,&local_40);
        if (iVar3 < 0) {
          lVar6 = -1;
        }
        else {
          lVar6 = local_40.tv_nsec / 1000 + local_40.tv_sec * 1000000;
        }
        Abc_Print(iVar9,"%s =","Time");
        Abc_Print(iVar9,"%9.2f sec\n",(double)(lVar6 + local_80) / 1000000.0);
        Llb_ManResultPrint(p,vResult);
      }
      return vResult;
    }
    uVar10 = (uint)local_50;
    if (uVar11 == uVar10) {
      if (uVar10 < 0x10) {
        __ptr = (void **)realloc(__ptr,0x80);
        local_50 = 0x10;
      }
      else {
        local_50 = (ulong)(uVar10 * 2);
        __ptr = (void **)realloc(__ptr,local_50 * 8);
      }
      vResult->nCap = (int)local_50;
    }
    vResult->nSize = uVar11 + 1;
    __ptr[local_70] = (void *)0x0;
    if (uVar7 < uVar11) {
      lVar5 = local_78;
      do {
        if (((int)lVar5 + 3 < 2) || (uVar1 = lVar5 + 1, local_70 < uVar1)) {
          vResult->pArray = __ptr;
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h"
                        ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
        }
        __ptr[lVar5 + 2] = __ptr[lVar5 + 1];
        lVar5 = lVar5 + -1;
      } while (lVar6 >> 0x20 < (long)uVar1);
    }
    if (uVar11 < uVar7) {
      vResult->pArray = __ptr;
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h"
                    ,0x1a6,"void Vec_PtrWriteEntry(Vec_Ptr_t *, int, void *)");
    }
    __ptr[uVar8 & 0xffffffff] = vLower;
    local_68 = local_68 + -1;
    local_78 = local_78 + 1;
    local_70 = (ulong)(uVar11 + 1);
  } while( true );
}

Assistant:

Vec_Ptr_t * Llb_ManComputeCuts( Aig_Man_t * p, int Num, int fVerbose, int fVeryVerbose )
{
    int nVolMax = Aig_ManNodeNum(p) / Num;
    Vec_Ptr_t * vResult, * vMinCut = NULL, * vLower, * vUpper;
    int i, k, nVol;
    abctime clk = Abc_Clock();
    vResult = Vec_PtrAlloc( 100 );
    Vec_PtrPush( vResult, Llb_ManComputeCutLo(p) );
    Vec_PtrPush( vResult, Llb_ManComputeCutLi(p) );
    while ( 1 ) 
    {
        // find a place to insert new cut
        vLower = (Vec_Ptr_t *)Vec_PtrEntry( vResult, 0 );
        Vec_PtrForEachEntryStart( Vec_Ptr_t *, vResult, vUpper, i, 1 )
        {
            nVol = Llb_ManCutVolume( p, vLower, vUpper );
            if ( nVol <= nVolMax )
            {
                vLower = vUpper;
                continue;
            }

            if ( fVeryVerbose )
            Llb_ManCutPrint( p, vLower,  vUpper );
            vMinCut = Llb_ManFlowFindBestCut( p, vLower, vUpper, Num );
            if ( vMinCut == NULL )
            {
                if ( fVeryVerbose )
                printf( "Could not break the cut.\n" );
                if ( fVeryVerbose )
                printf( "\n" );
                vLower = vUpper;
                continue;
            }

            if ( fVeryVerbose )
            Llb_ManCutPrint( p, vMinCut, vUpper );
            if ( fVeryVerbose )
            Llb_ManCutPrint( p, vLower,  vMinCut );
            if ( fVeryVerbose )
            printf( "\n" );

            break;
        }
        if ( i == Vec_PtrSize(vResult) )
            break;
        // insert vMinCut before vUpper
        Vec_PtrPush( vResult, NULL );
        for ( k = Vec_PtrSize(vResult) - 1; k > i; k-- )
            Vec_PtrWriteEntry( vResult, k, Vec_PtrEntry(vResult, k-1) );
        Vec_PtrWriteEntry( vResult, i, vMinCut );
    }
    if ( fVerbose )
    {
        printf( "Finished computing %d partitions.  ", Vec_PtrSize(vResult) - 1 );
        Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
        Llb_ManResultPrint( p, vResult );
    }
    return vResult;
}